

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

void __thiscall
estl::vector_s<unsigned_int,10ul>::swap<9ul>
          (vector_s<unsigned_int,10ul> *this,vector_s<unsigned_int,_9UL> *other)

{
  vector_s<unsigned_int,_10UL> temp;
  vector_s<unsigned_int,_10UL> vStack_48;
  
  if ((other->size_ < 0xb) && (*(ulong *)this < 10)) {
    vector_s<unsigned_int,_10UL>::vector_s(&vStack_48,(vector_s<unsigned_int,_10UL> *)this);
    operator=(this,other);
    vector_s<unsigned_int,9ul>::operator=((vector_s<unsigned_int,9ul> *)other,&vStack_48);
  }
  return;
}

Assistant:

void swap(vector_s<T, CAPACITY_OTHER>& other) noexcept
    {
        if ( other.size() > capacity() ||
             other.capacity() < size() ) {
            return;
        }
        vector_s temp(*this);
        *this = other;
        other = temp;
    }